

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinM062X_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double rho_00;
  ulong uVar1;
  double sigma_00;
  double dVar2;
  double tau_00;
  double vl;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  const_host_buffer_type local_48;
  const_host_buffer_type local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    local_50 = scal_fact;
    local_48 = sigma;
    local_40 = tau;
    do {
      rho_00 = rho[uVar1];
      if (rho_00 <= 1e-15) {
        local_58 = 0.0;
        local_60 = 0.0;
        local_68 = 0.0;
        local_38 = 0.0;
        local_70 = 0.0;
      }
      else {
        dVar2 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= local_48[uVar1]) {
          dVar2 = local_48[uVar1];
        }
        tau_00 = 1e-20;
        if (1e-20 <= local_40[uVar1]) {
          tau_00 = local_40[uVar1];
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (dVar2 <= sigma_00) {
          sigma_00 = dVar2;
        }
        kernel_traits<ExchCXX::BuiltinM062X_X>::eval_exc_vxc_unpolar_impl
                  (rho_00,sigma_00,0.0,tau_00,&local_58,&local_60,&local_68,&local_38,&local_70);
        scal_fact = local_50;
      }
      eps[uVar1] = local_58 * scal_fact + eps[uVar1];
      vrho[uVar1] = local_60 * scal_fact + vrho[uVar1];
      vsigma[uVar1] = local_68 * scal_fact + vsigma[uVar1];
      vtau[uVar1] = local_70 * scal_fact + vtau[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    const auto lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    double e, vr, vs, vl, vt;
    
    traits::eval_exc_vxc_unpolar( rho[i], sigma[i], lapl_i, tau[i], 
      e, vr, vs, vl, vt );
    eps[i]    += scal_fact * e;
    vrho[i]   += scal_fact * vr;
    vsigma[i] += scal_fact * vs;
    vtau[i]   += scal_fact * vt;
    if(traits::needs_laplacian) vlapl[i] += scal_fact * vl;

  }


}